

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeSStolerances(void *cvode_mem,sunrealtype reltol,sunrealtype abstol)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x3f1;
  }
  else if (*(int *)((long)cvode_mem + 0x848) == 0) {
    msgfmt = "Attempt to call before CVodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
    line = 0x3f8;
  }
  else if (0.0 <= reltol) {
    if (0.0 <= abstol) {
      *(sunrealtype *)((long)cvode_mem + 0x28) = reltol;
      *(sunrealtype *)((long)cvode_mem + 0x30) = abstol;
      *(uint *)((long)cvode_mem + 0x40) = -(uint)(abstol == 0.0) & 1;
      *(undefined4 *)((long)cvode_mem + 0x24) = 1;
      *(undefined4 *)((long)cvode_mem + 0x44) = 0;
      *(code **)((long)cvode_mem + 0x48) = cvEwtSet;
      *(undefined8 *)((long)cvode_mem + 0x50) = 0;
      return 0;
    }
    msgfmt = "abstol has negative component(s) (illegal).";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x408;
  }
  else {
    msgfmt = "reltol < 0 illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x401;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSStolerances",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeSStolerances(void* cvode_mem, sunrealtype reltol, sunrealtype abstol)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOL);
    return (CV_ILL_INPUT);
  }

  if (abstol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ABSTOL);
    return (CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  cv_mem->cv_reltol   = reltol;
  cv_mem->cv_Sabstol  = abstol;
  cv_mem->cv_atolmin0 = (abstol == ZERO);

  cv_mem->cv_itol = CV_SS;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun      = cvEwtSet;
  cv_mem->cv_e_data    = NULL; /* will be set to cvode_mem in InitialSetup */

  return (CV_SUCCESS);
}